

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

int lookup(node *table,char *key)

{
  uint uVar1;
  int iVar2;
  node *it;
  uint index;
  char *key_local;
  node *table_local;
  
  uVar1 = hash(key,0x1e);
  if (table + uVar1 == (node *)0x0) {
    table_local._4_4_ = 0;
  }
  else {
    iVar2 = strcmp(table[uVar1].key,key);
    if (iVar2 == 0) {
      table_local._4_4_ = 0;
    }
    else {
      table_local._4_4_ = 1;
    }
  }
  return table_local._4_4_;
}

Assistant:

int lookup(node *table, const char *key)
{
    unsigned index = hash(key, TABLESIZE);
    const node *it = &table[index];

    if(it == NULL){
        return 0;
    }
    if(strcmp(it->key, key)){
        return 1;
    }
    // Попытка установить наличие соответствующего ключа в связанном списке
    /*
    while(it != NULL && strcmp(it->key, key) != 0)
    {
        it = it->next;
    }*/
    return 0;
}